

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

double double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,uc16 separator,bool parse_as_hex_float,
                 bool allow_trailing_junk,double junk_string_value,bool read_as_double,
                 bool *result_is_junk)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  undefined6 in_register_0000000a;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  Double *this;
  char **ppcVar11;
  byte bVar12;
  char *pcVar13;
  double dVar14;
  DiyFp diy_fp;
  undefined7 in_stack_00000009;
  char *local_58;
  uint local_4c;
  undefined8 local_48;
  ulong local_40;
  char **local_38;
  
  ppcVar11 = (char **)CONCAT62(in_register_0000000a,separator);
  *(undefined1 *)CONCAT71(in_stack_00000009,read_as_double) = 1;
  local_58 = end;
  while (**current == '0') {
    bVar2 = Advance<char*>(current,separator,(int)&local_58,ppcVar11);
    if (bVar2) {
      *(undefined1 *)CONCAT71(in_stack_00000009,read_as_double) = 0;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  local_38 = (char **)0x18;
  if (allow_trailing_junk) {
    local_38 = (char **)0x35;
  }
  local_40 = 1L << (sbyte)local_38;
  local_48 = 5;
  pcVar13 = *current;
  iVar4 = (int)*pcVar13;
  if (iVar4 - 0x30U < 10 && iVar4 < 0x38) {
    lVar8 = (long)iVar4 + -0x30;
    uVar6 = lVar8 >> (sbyte)local_38;
    if ((int)uVar6 != 0) {
      ppcVar11 = (char **)0x1;
      if (1 < (int)uVar6) {
        uVar9 = uVar6 & 0xffffffff;
        do {
          ppcVar11 = (char **)(ulong)((int)ppcVar11 + 1);
          uVar9 = uVar9 >> 1;
          uVar5 = (uint)uVar6;
          uVar6 = uVar9;
        } while (3 < uVar5);
      }
      iVar4 = (int)ppcVar11;
      bVar7 = (byte)ppcVar11;
      local_4c = -1 << (bVar7 & 0x1f);
      uVar6 = lVar8 >> (bVar7 & 0x3f);
      bVar2 = Advance<char*>(current,separator,(int)&local_58,ppcVar11);
      bVar12 = 1;
      while (!bVar2) {
        cVar1 = **current;
        if ((0x37 < cVar1) || (uVar5 = (int)cVar1 - 0x30, 9 < uVar5)) break;
        bVar12 = bVar12 & cVar1 == '0';
        iVar4 = iVar4 + 3;
        bVar2 = Advance<char*>(current,separator,(int)&local_58,(char **)(ulong)uVar5);
      }
      if (!parse_as_hex_float) {
        pcVar13 = *current;
        bVar2 = pcVar13 != end;
        if ((bVar2) && (bVar3 = isWhitespace((int)*pcVar13), bVar3)) {
          do {
            pcVar13 = pcVar13 + 1;
            *current = pcVar13;
            bVar2 = pcVar13 != end;
            if (pcVar13 == end) break;
            bVar3 = isWhitespace((int)*pcVar13);
          } while (bVar3);
        }
        uVar5 = 1;
        if (bVar2) goto LAB_0087b008;
      }
      uVar10 = (uint)lVar8 & ~local_4c;
      uVar5 = 1 << (bVar7 - 1 & 0x1f);
      if ((int)uVar5 < (int)uVar10) {
        bVar2 = (local_40 & uVar6 + 1) != 0;
        this = (Double *)((long)(uVar6 + 1) >> bVar2);
      }
      else {
        if (uVar10 == uVar5) {
          uVar6 = uVar6 + ((byte)(~bVar12 | (byte)uVar6) & 1);
        }
        bVar2 = (local_40 & uVar6) != 0;
        this = (Double *)((long)uVar6 >> bVar2);
      }
      *(undefined1 *)CONCAT71(in_stack_00000009,read_as_double) = 0;
      if ((iVar4 + (uint)bVar2 != 0) && (this != (Double *)0x0)) {
        diy_fp.f_ = (ulong)(iVar4 + (uint)bVar2);
        diy_fp._8_8_ = this;
        dVar14 = (double)Double::DiyFpToUint64(this,diy_fp);
        if (sign) {
          return (double)((ulong)dVar14 ^ (ulong)DAT_00c49930);
        }
        return dVar14;
      }
      if (sign) {
        if (this == (Double *)0x0) {
          return -0.0;
        }
        this = (Double *)-(long)this;
      }
      return (double)(long)this;
    }
    bVar2 = Advance<char*>(current,separator,(int)&local_58,local_38);
    uVar5 = (uint)bVar2 + (uint)bVar2 * 4;
  }
  else {
    uVar5 = 5;
    if (!parse_as_hex_float) {
      bVar2 = pcVar13 != end;
      if ((bVar2) && (bVar3 = isWhitespace((int)*pcVar13), bVar3)) {
        do {
          pcVar13 = pcVar13 + 1;
          *current = pcVar13;
          bVar2 = pcVar13 != end;
          if (pcVar13 == end) break;
          bVar3 = isWhitespace((int)*pcVar13);
        } while (bVar3);
      }
      if (bVar2) {
        return junk_string_value;
      }
    }
  }
LAB_0087b008:
  dVar14 = (double)(*(code *)(&DAT_00c499b8 + *(int *)(&DAT_00c499b8 + (ulong)uVar5 * 4)))();
  return dVar14;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}